

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::TableRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TableRelation *this,idx_t depth)

{
  pointer catalog;
  pointer pTVar1;
  pointer pTVar2;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> *this_00
  ;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_40,(Relation *)depth,depth);
  ::std::operator+(&local_80,&local_40,"Scan Table [");
  this_00 = &this->description;
  catalog = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
            ::operator->(this_00);
  pTVar1 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_00);
  pTVar2 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_00);
  ParseInfo::QualifierToString(&local_a0,&catalog->database,&pTVar1->schema,&pTVar2->table);
  ::std::operator+(&local_60,&local_80,&local_a0);
  ::std::operator+(__return_storage_ptr__,&local_60,"]");
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string TableRelation::ToString(idx_t depth) {
	return RenderWhitespace(depth) + "Scan Table [" +
	       ParseInfo::QualifierToString(description->database, description->schema, description->table) + "]";
}